

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3PendingListAppend
              (PendingList **pp,sqlite3_int64 iDocid,sqlite3_int64 iCol,sqlite3_int64 iPos,int *pRc)

{
  PendingList *pPVar1;
  int iVar2;
  sqlite3_int64 i;
  PendingList *p;
  
  p = *pp;
  i = iDocid;
  if (p == (PendingList *)0x0) {
LAB_001a84cd:
    iVar2 = fts3PendingListAppendVarint(&p,i);
    if (iVar2 != 0) goto LAB_001a8534;
    p->iLastCol = -1;
    p->iLastPos = 0;
    p->iLastDocid = iDocid;
  }
  else {
    i = iDocid - p->iLastDocid;
    if (i != 0) {
      p->nData = p->nData + 1;
      goto LAB_001a84cd;
    }
  }
  if (iCol < 1) {
    if (-1 < iCol) goto LAB_001a8510;
  }
  else {
    if (p->iLastCol != iCol) {
      iVar2 = fts3PendingListAppendVarint(&p,1);
      if ((iVar2 != 0) || (iVar2 = fts3PendingListAppendVarint(&p,iCol), iVar2 != 0))
      goto LAB_001a8534;
      p->iLastCol = iCol;
      p->iLastPos = 0;
    }
LAB_001a8510:
    iVar2 = fts3PendingListAppendVarint(&p,(iPos - p->iLastPos) + 2);
    if (iVar2 != 0) goto LAB_001a8534;
    p->iLastPos = iPos;
  }
  iVar2 = 0;
LAB_001a8534:
  *pRc = iVar2;
  pPVar1 = *pp;
  if (p != pPVar1) {
    *pp = p;
  }
  return (uint)(p != pPVar1);
}

Assistant:

static int fts3PendingListAppend(
  PendingList **pp,               /* IN/OUT: PendingList structure */
  sqlite3_int64 iDocid,           /* Docid for entry to add */
  sqlite3_int64 iCol,             /* Column for entry to add */
  sqlite3_int64 iPos,             /* Position of term for entry to add */
  int *pRc                        /* OUT: Return code */
){
  PendingList *p = *pp;
  int rc = SQLITE_OK;

  assert( !p || p->iLastDocid<=iDocid );

  if( !p || p->iLastDocid!=iDocid ){
    sqlite3_int64 iDelta = iDocid - (p ? p->iLastDocid : 0);
    if( p ){
      assert( p->nData<p->nSpace );
      assert( p->aData[p->nData]==0 );
      p->nData++;
    }
    if( SQLITE_OK!=(rc = fts3PendingListAppendVarint(&p, iDelta)) ){
      goto pendinglistappend_out;
    }
    p->iLastCol = -1;
    p->iLastPos = 0;
    p->iLastDocid = iDocid;
  }
  if( iCol>0 && p->iLastCol!=iCol ){
    if( SQLITE_OK!=(rc = fts3PendingListAppendVarint(&p, 1))
     || SQLITE_OK!=(rc = fts3PendingListAppendVarint(&p, iCol))
    ){
      goto pendinglistappend_out;
    }
    p->iLastCol = iCol;
    p->iLastPos = 0;
  }
  if( iCol>=0 ){
    assert( iPos>p->iLastPos || (iPos==0 && p->iLastPos==0) );
    rc = fts3PendingListAppendVarint(&p, 2+iPos-p->iLastPos);
    if( rc==SQLITE_OK ){
      p->iLastPos = iPos;
    }
  }

 pendinglistappend_out:
  *pRc = rc;
  if( p!=*pp ){
    *pp = p;
    return 1;
  }
  return 0;
}